

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

RawVecSize
dxil_spv::raw_access_byte_address_vectorize(Impl *impl,Type *type,Value *byte_offset,uint32_t mask)

{
  bool bVar1;
  
  if (mask == 3) {
    bVar1 = raw_access_byte_address_can_vectorize(impl,type,byte_offset,2);
    if (bVar1) {
      return V2;
    }
  }
  else if (mask == 7) {
    bVar1 = raw_access_byte_address_can_vectorize(impl,type,byte_offset,3);
    if (bVar1) {
      return V3;
    }
  }
  else if ((mask == 0xf) &&
          (bVar1 = raw_access_byte_address_can_vectorize(impl,type,byte_offset,4), bVar1)) {
    return V4;
  }
  return V1;
}

Assistant:

RawVecSize raw_access_byte_address_vectorize(
	Converter::Impl &impl, const llvm::Type *type,
    const llvm::Value *byte_offset, uint32_t mask)
{
	if (mask == 0xfu && raw_access_byte_address_can_vectorize(impl, type, byte_offset, 4))
		return RawVecSize::V4;
	else if (mask == 0x7u && raw_access_byte_address_can_vectorize(impl, type, byte_offset, 3))
		return RawVecSize::V3;
	else if (mask == 0x3u && raw_access_byte_address_can_vectorize(impl, type, byte_offset, 2))
		return RawVecSize::V2;
	else
		return RawVecSize::V1;
}